

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall testing::AssertionFailure(testing *this,Message *message)

{
  AssertionResult *other;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar1;
  Message *message_local;
  AssertionResult local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  AssertionFailure();
  other = AssertionResult::operator<<(&local_20,message);
  AssertionResult::AssertionResult((AssertionResult *)this,other);
  AssertionResult::~AssertionResult(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    AVar1.message_.ptr_ = extraout_RDX.ptr_;
    AVar1._0_8_ = this;
    return AVar1;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult AssertionFailure(const Message& message) {
  return AssertionFailure() << message;
}